

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O3

bool winmd::reader::database::is_database(string_view *path)

{
  image_section_header *piVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  uint32_t uVar5;
  image_section_header *piVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  file_view file;
  byte_view local_58;
  char local_48;
  string local_40;
  
  file_view::open_file((file_view *)&local_40,path);
  local_58.m_first = (uint8_t *)local_40._M_dataplus._M_p;
  local_58.m_last = (uint8_t *)local_40._M_string_length;
  local_48 = '\x01';
  if (((int)local_40._M_string_length - (int)local_40._M_dataplus._M_p & 0xffffffc0U) != 0) {
    byte_view::check_available(&local_58,0x40);
    if (*(short *)local_58.m_first == 0x5a4d) {
      uVar4 = *(uint *)((long)local_58.m_first + 0x3c);
      uVar7 = (long)(int)uVar4 + 0xf8;
      if (uVar7 <= (uint)((int)local_58.m_last - (int)local_58.m_first)) {
        uVar10 = (ulong)uVar4;
        byte_view::check_available(&local_58,uVar4 + 0xf8);
        uVar2 = *(ushort *)((long)local_58.m_first + uVar10 + 6);
        if (0xff9b < (ushort)(uVar2 - 0x65)) {
          sVar3 = *(short *)((long)local_58.m_first + uVar10 + 0x18);
          if (sVar3 == 0x20b) {
            byte_view::check_available(&local_58,uVar4 + 0x108);
            iVar9 = *(int *)((long)local_58.m_first + uVar10 + 0xf8);
            byte_view::check_available(&local_58,uVar4 + 0x130);
            uVar7 = (ulong)(uVar4 + 0x108);
          }
          else {
            if (sVar3 != 0x10b) {
              local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_40,"Invalid optional header magic value","");
              impl::throw_invalid(&local_40);
            }
            iVar9 = *(int *)((long)local_58.m_first + uVar10 + 0xe8);
            byte_view::check_available(&local_58,(int)uVar7 + 0x28);
          }
          lVar8 = uVar7 + (long)local_58.m_first;
          piVar1 = (image_section_header *)(lVar8 + (ulong)uVar2 * 0x28);
          piVar6 = std::
                   __find_if<winmd::impl::image_section_header_const*,__gnu_cxx::__ops::_Iter_pred<winmd::reader::database::section_from_rva(winmd::impl::image_section_header_const*,winmd::impl::image_section_header_const*,unsigned_int)::_lambda(auto:1&&)_1_>>
                             (lVar8,piVar1,iVar9);
          if (piVar6 != piVar1) {
            iVar9 = iVar9 - piVar6->VirtualAddress;
            uVar5 = piVar6->PointerToRawData;
            byte_view::check_available(&local_58,iVar9 + uVar5 + 0x48);
            uVar7 = (ulong)(iVar9 + uVar5);
            if (*(int *)((long)local_58.m_first + uVar7) == 0x48) {
              iVar9 = *(int *)((long)local_58.m_first + uVar7 + 8);
              piVar6 = std::
                       __find_if<winmd::impl::image_section_header_const*,__gnu_cxx::__ops::_Iter_pred<winmd::reader::database::section_from_rva(winmd::impl::image_section_header_const*,winmd::impl::image_section_header_const*,unsigned_int)::_lambda(auto:1&&)_1_>>
                                 (lVar8,piVar1,iVar9);
              if (piVar6 != piVar1) {
                iVar9 = iVar9 - piVar6->VirtualAddress;
                uVar5 = piVar6->PointerToRawData;
                byte_view::check_available(&local_58,iVar9 + uVar5 + 4);
                bVar11 = *(int *)((long)local_58.m_first + (ulong)(iVar9 + uVar5)) == 0x424a5342;
                goto LAB_00156a14;
              }
            }
          }
        }
      }
    }
  }
  bVar11 = false;
LAB_00156a14:
  if (local_48 == '\x01') {
    munmap(local_58.m_first,(ulong)(uint)((int)local_58.m_last - (int)local_58.m_first));
  }
  return bVar11;
}

Assistant:

static bool is_database(std::string_view const& path)
        {
            file_view file{ path };

            if (file.size() < sizeof(impl::image_dos_header))
            {
                return false;
            }

            auto dos = file.as<impl::image_dos_header>();

            if (dos.e_signature != 0x5A4D) // IMAGE_DOS_SIGNATURE
            {
                return false;
            }

            if (file.size() < (dos.e_lfanew + sizeof(impl::image_nt_headers32)))
            {
                return false;
            }

            auto pe = file.as<impl::image_nt_headers32>(dos.e_lfanew);

            if (pe.FileHeader.NumberOfSections == 0 || pe.FileHeader.NumberOfSections > 100)
            {
                return false;
            }
            
            impl::image_section_header const* sections{};
            uint32_t com_virtual_address{};
            if (pe.OptionalHeader.Magic == 0x10B) // PE32
            {
                com_virtual_address = pe.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &file.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32));
            }
            else if (pe.OptionalHeader.Magic == 0x20B) // PE32+
            {
                auto pe_plus = file.as<impl::image_nt_headers32plus>(dos.e_lfanew);
                com_virtual_address = pe_plus.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &file.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32plus));
            }
            else
            {
                impl::throw_invalid("Invalid optional header magic value");
            }
            auto sections_end = sections + pe.FileHeader.NumberOfSections;
            auto section = section_from_rva(sections, sections_end, com_virtual_address);

            if (section == sections_end)
            {
                return false;
            }

            auto offset = offset_from_rva(*section, com_virtual_address);

            auto cli = file.as<impl::image_cor20_header>(offset);

            if (cli.cb != sizeof(impl::image_cor20_header))
            {
                return false;
            }

            section = section_from_rva(sections, sections_end, cli.MetaData.VirtualAddress);

            if (section == sections_end)
            {
                return false;
            }

            offset = offset_from_rva(*section, cli.MetaData.VirtualAddress);

            if (file.as<uint32_t>(offset) != 0x424a5342)
            {
                return false;
            }

            return true;
        }